

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reed-solomon.c
# Opt level: O2

void correct_reed_solomon_destroy(correct_reed_solomon *rs)

{
  field_logarithm_t *__ptr;
  undefined8 uVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  undefined4 uVar6;
  undefined8 uVar7;
  undefined4 uVar8;
  undefined8 uVar9;
  undefined4 uVar10;
  undefined8 uVar11;
  undefined4 uVar12;
  undefined8 uVar13;
  undefined4 uVar14;
  undefined8 uVar15;
  undefined4 uVar16;
  undefined8 uVar17;
  undefined4 uVar18;
  undefined8 uVar19;
  undefined4 uVar20;
  undefined8 uVar21;
  undefined4 uVar22;
  undefined8 uVar23;
  undefined4 uVar24;
  uint uVar25;
  field_operation_t i;
  long lVar26;
  polynomial_t polynomial;
  polynomial_t polynomial_00;
  polynomial_t polynomial_01;
  polynomial_t polynomial_02;
  polynomial_t polynomial_03;
  polynomial_t polynomial_04;
  polynomial_t polynomial_05;
  polynomial_t polynomial_06;
  polynomial_t polynomial_07;
  polynomial_t polynomial_08;
  polynomial_t polynomial_09;
  polynomial_t polynomial_10;
  
  __ptr = (rs->field).log;
  free((rs->field).exp);
  free(__ptr);
  uVar1 = (rs->generator).coeff;
  uVar2 = (rs->generator).order;
  polynomial.order = uVar2;
  polynomial.coeff = (field_element_t *)uVar1;
  polynomial._12_4_ = 0;
  polynomial_destroy(polynomial);
  free(rs->generator_roots);
  uVar3 = (rs->encoded_polynomial).coeff;
  uVar4 = (rs->encoded_polynomial).order;
  polynomial_00.order = uVar4;
  polynomial_00.coeff = (field_element_t *)uVar3;
  polynomial_00._12_4_ = 0;
  polynomial_destroy(polynomial_00);
  uVar5 = (rs->encoded_remainder).coeff;
  uVar6 = (rs->encoded_remainder).order;
  polynomial_01.order = uVar6;
  polynomial_01.coeff = (field_element_t *)uVar5;
  polynomial_01._12_4_ = 0;
  polynomial_destroy(polynomial_01);
  if (rs->has_init_decode == true) {
    free(rs->syndromes);
    free(rs->modified_syndromes);
    uVar7 = (rs->received_polynomial).coeff;
    uVar8 = (rs->received_polynomial).order;
    polynomial_02.order = uVar8;
    polynomial_02.coeff = (field_element_t *)uVar7;
    polynomial_02._12_4_ = 0;
    polynomial_destroy(polynomial_02);
    uVar9 = (rs->error_locator).coeff;
    uVar10 = (rs->error_locator).order;
    polynomial_03.order = uVar10;
    polynomial_03.coeff = (field_element_t *)uVar9;
    polynomial_03._12_4_ = 0;
    polynomial_destroy(polynomial_03);
    uVar11 = (rs->error_locator_log).coeff;
    uVar12 = (rs->error_locator_log).order;
    polynomial_04.order = uVar12;
    polynomial_04.coeff = (field_element_t *)uVar11;
    polynomial_04._12_4_ = 0;
    polynomial_destroy(polynomial_04);
    uVar13 = (rs->erasure_locator).coeff;
    uVar14 = (rs->erasure_locator).order;
    polynomial_05.order = uVar14;
    polynomial_05.coeff = (field_element_t *)uVar13;
    polynomial_05._12_4_ = 0;
    polynomial_destroy(polynomial_05);
    free(rs->error_roots);
    free(rs->error_vals);
    free(rs->error_locations);
    uVar15 = (rs->last_error_locator).coeff;
    uVar16 = (rs->last_error_locator).order;
    polynomial_06.order = uVar16;
    polynomial_06.coeff = (field_element_t *)uVar15;
    polynomial_06._12_4_ = 0;
    polynomial_destroy(polynomial_06);
    uVar17 = (rs->error_evaluator).coeff;
    uVar18 = (rs->error_evaluator).order;
    polynomial_07.order = uVar18;
    polynomial_07.coeff = (field_element_t *)uVar17;
    polynomial_07._12_4_ = 0;
    polynomial_destroy(polynomial_07);
    uVar19 = (rs->error_locator_derivative).coeff;
    uVar20 = (rs->error_locator_derivative).order;
    polynomial_08.order = uVar20;
    polynomial_08.coeff = (field_element_t *)uVar19;
    polynomial_08._12_4_ = 0;
    polynomial_destroy(polynomial_08);
    uVar25 = 0;
    while( true ) {
      if (rs->min_distance <= (ulong)uVar25) break;
      free(rs->generator_root_exp[uVar25]);
      uVar25 = uVar25 + 1;
    }
    free(rs->generator_root_exp);
    for (lVar26 = 0; lVar26 != 0x100; lVar26 = lVar26 + 1) {
      free(rs->element_exp[lVar26]);
    }
    free(rs->element_exp);
    uVar21 = rs->init_from_roots_scratch[0].coeff;
    uVar22 = rs->init_from_roots_scratch[0].order;
    polynomial_09.order = uVar22;
    polynomial_09.coeff = (field_element_t *)uVar21;
    polynomial_09._12_4_ = 0;
    polynomial_destroy(polynomial_09);
    uVar23 = rs->init_from_roots_scratch[1].coeff;
    uVar24 = rs->init_from_roots_scratch[1].order;
    polynomial_10.order = uVar24;
    polynomial_10.coeff = (field_element_t *)uVar23;
    polynomial_10._12_4_ = 0;
    polynomial_destroy(polynomial_10);
  }
  free(rs);
  return;
}

Assistant:

void correct_reed_solomon_destroy(correct_reed_solomon *rs) {
    field_destroy(rs->field);
    polynomial_destroy(rs->generator);
    free(rs->generator_roots);
    polynomial_destroy(rs->encoded_polynomial);
    polynomial_destroy(rs->encoded_remainder);
    if (rs->has_init_decode) {
        free(rs->syndromes);
        free(rs->modified_syndromes);
        polynomial_destroy(rs->received_polynomial);
        polynomial_destroy(rs->error_locator);
        polynomial_destroy(rs->error_locator_log);
        polynomial_destroy(rs->erasure_locator);
        free(rs->error_roots);
        free(rs->error_vals);
        free(rs->error_locations);
        polynomial_destroy(rs->last_error_locator);
        polynomial_destroy(rs->error_evaluator);
        polynomial_destroy(rs->error_locator_derivative);
        for (unsigned int i = 0; i < rs->min_distance; i++) {
            free(rs->generator_root_exp[i]);
        }
        free(rs->generator_root_exp);
        for (field_operation_t i = 0; i < 256; i++) {
            free(rs->element_exp[i]);
        }
        free(rs->element_exp);
        polynomial_destroy(rs->init_from_roots_scratch[0]);
        polynomial_destroy(rs->init_from_roots_scratch[1]);
    }
    free(rs);
}